

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  undefined1 auVar1 [16];
  xpath_node pivot;
  xml_node in_RDX;
  xml_attribute in_RSI;
  xpath_node *in_RDI;
  xpath_node **unaff_retaddr;
  xpath_node *eqend;
  xpath_node *eqbeg;
  xpath_node *median;
  xpath_node *middle;
  document_order_comparator *in_stack_ffffffffffffffa8;
  xml_node_struct *in_stack_ffffffffffffffb8;
  xml_attribute_struct *in_stack_ffffffffffffffc0;
  xpath_node *in_stack_ffffffffffffffc8;
  xml_attribute_struct *in_stack_ffffffffffffffd0;
  xpath_node *in_stack_ffffffffffffffd8;
  xpath_node *in_stack_ffffffffffffffe0;
  xpath_node *local_8;
  
  local_8 = in_RDI;
  while (0x10 < (long)in_RSI._attr - (long)local_8 >> 4) {
    auVar1._8_8_ = (long)in_RSI._attr - (long)local_8 >> 0x3f;
    auVar1._0_8_ = (long)in_RSI._attr - (long)local_8 >> 4;
    in_stack_ffffffffffffffe0 = local_8 + SUB168(auVar1 / SEXT816(2),0);
    in_stack_ffffffffffffffd8 =
         median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                   ((xpath_node *)in_stack_ffffffffffffffc0,(xpath_node *)in_stack_ffffffffffffffb8,
                    local_8,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb8 = (in_stack_ffffffffffffffd8->_node)._root;
    in_stack_ffffffffffffffc0 = (in_stack_ffffffffffffffd8->_attribute)._attr;
    in_stack_ffffffffffffffa8 = (document_order_comparator *)&stack0xffffffffffffffc8;
    pivot._attribute._attr = in_RSI._attr;
    pivot._node._root = in_RDX._root;
    partition3<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,pivot,
               (document_order_comparator *)in_stack_ffffffffffffffd0,
               (xpath_node **)in_stack_ffffffffffffffc8,unaff_retaddr);
    if ((long)in_RSI._attr - (long)in_stack_ffffffffffffffc8 >> 4 <
        (long)in_stack_ffffffffffffffd0 - (long)local_8 >> 4) {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((xpath_node *)in_RSI._attr,(xpath_node *)in_RDX._root,
                 (document_order_comparator *)in_stack_ffffffffffffffe0);
      in_RSI._attr = in_stack_ffffffffffffffd0;
    }
    else {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((xpath_node *)in_RSI._attr,(xpath_node *)in_RDX._root,
                 (document_order_comparator *)in_stack_ffffffffffffffe0);
      local_8 = in_stack_ffffffffffffffc8;
    }
  }
  insertion_sort<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (document_order_comparator *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

PUGI__FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}